

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QDockAreaLayoutInfo * __thiscall QDockWidgetGroupWindow::tabLayoutInfo(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  QLayout *pQVar2;
  QDockAreaLayoutInfo *pQVar3;
  char cVar4;
  QDockAreaLayoutInfo *pQVar5;
  QDockAreaLayoutInfo *pQVar6;
  long lVar7;
  char cVar8;
  QDockAreaLayoutInfo *unaff_R14;
  QDockAreaLayoutItem *this_00;
  
  pQVar2 = QWidget::layout((QWidget *)this);
  pQVar5 = (QDockAreaLayoutInfo *)&pQVar2[4].super_QLayoutItem;
  do {
    if (pQVar5 == (QDockAreaLayoutInfo *)0x0) {
      return (QDockAreaLayoutInfo *)0x0;
    }
    if (pQVar5->tabbed != false) {
      return pQVar5;
    }
    lVar7 = (pQVar5->item_list).d.size;
    cVar4 = '\x04';
    if (lVar7 == 0) {
      pQVar6 = (QDockAreaLayoutInfo *)0x0;
      cVar8 = false;
    }
    else {
      this_00 = (pQVar5->item_list).d.ptr;
      lVar7 = lVar7 * 0x28;
      cVar8 = false;
      pQVar6 = (QDockAreaLayoutInfo *)0x0;
      do {
        bVar1 = QDockAreaLayoutItem::skip(this_00);
        cVar4 = '\x05';
        if ((!bVar1) && ((this_00->flags & 1) == 0)) {
          cVar4 = '\x01';
          if ((pQVar6 != (QDockAreaLayoutInfo *)0x0) || ((bool)cVar8)) {
            unaff_R14 = (QDockAreaLayoutInfo *)0x0;
          }
          else {
            pQVar6 = this_00->subinfo;
            cVar4 = '\0';
            if (pQVar6 == (QDockAreaLayoutInfo *)0x0) {
              if (this_00->widgetItem != (QLayoutItem *)0x0) {
                cVar8 = true;
              }
              pQVar6 = (QDockAreaLayoutInfo *)0x0;
              cVar4 = '\0';
            }
          }
        }
        if ((cVar4 != '\x05') && (cVar4 != '\0')) goto LAB_00435fd2;
        this_00 = this_00 + 1;
        lVar7 = lVar7 + -0x28;
      } while (lVar7 != 0);
      cVar4 = '\x04';
    }
LAB_00435fd2:
    pQVar3 = unaff_R14;
    if ((bool)cVar8 != false) {
      pQVar3 = pQVar5;
      pQVar6 = pQVar5;
    }
    if (cVar4 != '\x04') {
      cVar8 = cVar4;
      pQVar6 = pQVar5;
      pQVar3 = unaff_R14;
    }
    unaff_R14 = pQVar3;
    pQVar5 = pQVar6;
    if (cVar8 != '\0') {
      return unaff_R14;
    }
  } while( true );
}

Assistant:

QDockAreaLayoutInfo *QDockWidgetGroupWindow::layoutInfo() const
{
    return static_cast<QDockWidgetGroupLayout *>(layout())->dockAreaLayoutInfo();
}